

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

void __thiscall
Js::AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
          (AutoRegisterIgnoreExceptionWrapper *this,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggingFlags *this_00;
  
  this->m_threadContext = threadContext;
  bVar2 = IsRegistered(threadContext);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xf,"(!IsRegistered(threadContext))",
                                "BuiltInWrapper is already registered.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = DebugManager::GetDebuggingFlags(this->m_threadContext->debugManager);
  DebuggingFlags::SetIsBuiltInWrapperPresent(this_00,true);
  return;
}

Assistant:

AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper(ThreadContext* threadContext) :
        m_threadContext(threadContext)
    {
        AssertMsg(!IsRegistered(threadContext), "BuiltInWrapper is already registered.");
        m_threadContext->GetDebugManager()->GetDebuggingFlags()->SetIsBuiltInWrapperPresent(true);
    }